

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_rewriter.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::ExpressionRewriter::ConstantOrNull
          (ExpressionRewriter *this,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *children,Value *value)

{
  const_iterator __position;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var1;
  reference this_00;
  LogicalType type;
  ScalarFunction func;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_1b0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_1a8;
  LogicalType local_1a0;
  Value local_188;
  ScalarFunction local_148;
  
  LogicalType::LogicalType(&local_1a0,&value->type_);
  ConstantOrNullFun::GetFunction();
  this_00 = vector<duckdb::LogicalType,_true>::get<true>
                      (&local_148.super_BaseScalarFunction.super_SimpleFunction.arguments,0);
  LogicalType::operator=(this_00,&local_1a0);
  LogicalType::operator=(&local_148.super_BaseScalarFunction.return_type,&local_1a0);
  __position._M_current =
       (children->
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ).
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  make_uniq<duckdb::BoundConstantExpression,duckdb::Value&>((duckdb *)&local_1b0,value);
  local_1a8._M_head_impl = (Expression *)local_1b0._M_head_impl;
  local_1b0._M_head_impl = (FunctionData *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::_M_insert_rval(&children->
                    super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ,__position,(value_type *)&local_1a8);
  if (local_1a8._M_head_impl != (Expression *)0x0) {
    (*((local_1a8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  local_1a8._M_head_impl = (Expression *)0x0;
  if (local_1b0._M_head_impl != (FunctionData *)0x0) {
    (*(local_1b0._M_head_impl)->_vptr_FunctionData[1])();
  }
  Value::Value(&local_188,value);
  duckdb::ConstantOrNull::Bind((ConstantOrNull *)&local_1b0,&local_188);
  make_uniq<duckdb::BoundFunctionExpression,duckdb::LogicalType&,duckdb::ScalarFunction&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>>
            ((duckdb *)&local_1a8,&local_1a0,&local_148,children,
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             &local_1b0);
  _Var1._M_head_impl = local_1a8._M_head_impl;
  local_1a8._M_head_impl = (Expression *)0x0;
  (this->super_LogicalOperatorVisitor)._vptr_LogicalOperatorVisitor =
       (_func_int **)_Var1._M_head_impl;
  if (local_1b0._M_head_impl != (FunctionData *)0x0) {
    (*(local_1b0._M_head_impl)->_vptr_FunctionData[1])();
  }
  local_1b0._M_head_impl = (FunctionData *)0x0;
  Value::~Value(&local_188);
  ScalarFunction::~ScalarFunction(&local_148);
  LogicalType::~LogicalType(&local_1a0);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> ExpressionRewriter::ConstantOrNull(vector<unique_ptr<Expression>> children, Value value) {
	auto type = value.type();
	auto func = ConstantOrNullFun::GetFunction();
	func.arguments[0] = type;
	func.return_type = type;
	children.insert(children.begin(), make_uniq<BoundConstantExpression>(value));
	return make_uniq<BoundFunctionExpression>(type, func, std::move(children), ConstantOrNull::Bind(std::move(value)));
}